

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry(ExceptionTranslatorRegistry *this)

{
  ExceptionTranslatorRegistry *this_local;
  
  (this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry =
       (_func_int **)&PTR__ExceptionTranslatorRegistry_002250e8;
  deleteAll<std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
            (&this->m_translators);
  std::
  vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ::~vector(&this->m_translators);
  IExceptionTranslatorRegistry::~IExceptionTranslatorRegistry
            (&this->super_IExceptionTranslatorRegistry);
  return;
}

Assistant:

~ExceptionTranslatorRegistry() {
            deleteAll( m_translators );
        }